

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBasisToolsBspline.h
# Opt level: O3

void chrono::geometry::ChBasisToolsBspline::BasisEvaluateDeriv
               (int p,int i,double u,ChVectorDynamic<> *knotU,ChMatrixDynamic<> *DN)

{
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  double *pdVar9;
  void *pvVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  double *pdVar14;
  ulong uVar15;
  uint uVar16;
  double *pdVar17;
  long lVar18;
  ulong uVar19;
  double *pdVar20;
  ulong uVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 auVar28 [64];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ChMatrixDynamic<> ndu;
  ChMatrixDynamic<> a;
  DenseStorage<double,__1,__1,__1,_1> local_e8;
  long local_d0;
  double *local_c8;
  long local_c0;
  ulong local_b8;
  double *local_b0;
  long local_a8;
  ulong local_a0;
  DenseStorage<double,__1,__1,__1,_1> local_98;
  double *local_80;
  ulong local_78;
  double *local_70;
  double *local_68;
  ulong local_60;
  long local_58;
  double *local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  uVar5 = (uint)(DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                m_rows;
  uVar19 = (ulong)(uint)p;
  uVar12 = p + 1;
  lVar25 = (long)(int)uVar12;
  uVar21 = 0xffffffffffffffff;
  if (-2 < p) {
    uVar21 = lVar25 * 8;
  }
  pdVar9 = (double *)operator_new__(uVar21);
  pvVar10 = operator_new__(uVar21);
  local_e8.m_cols = 0;
  local_e8.m_data = (double *)0x0;
  local_e8.m_rows = 0;
  if (p < -1) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_e8,lVar25 * lVar25,lVar25,lVar25);
  local_98.m_data = (double *)0x0;
  local_98.m_rows = 0;
  local_98.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_98,lVar25 * lVar25,lVar25,lVar25);
  if ((0 < local_e8.m_rows) && (0 < local_e8.m_cols)) {
    uVar21 = local_e8.m_cols;
    if ((ulong)local_e8.m_rows < (ulong)local_e8.m_cols) {
      uVar21 = local_e8.m_rows;
    }
    *local_e8.m_data = 1.0;
    if (0 < p) {
      uVar26 = 1;
      pdVar24 = (knotU->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      uVar15 = (knotU->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
      pdVar17 = pdVar9;
      pdVar23 = local_e8.m_data;
      pdVar14 = local_e8.m_data;
      do {
        pdVar14 = pdVar14 + local_e8.m_cols;
        pdVar23 = pdVar23 + 1;
        pdVar17 = pdVar17 + 1;
        iVar7 = (i + 1) - (int)uVar26;
        if ((iVar7 < 0) || ((long)uVar15 <= (long)iVar7)) {
LAB_0068ebf4:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        pdVar9[uVar26] = u - pdVar24[iVar7];
        uVar11 = uVar26 + (long)i;
        if (((long)uVar11 < 0) || (uVar15 <= uVar11)) goto LAB_0068ebf4;
        *(double *)((long)pvVar10 + uVar26 * 8) = pdVar24[uVar11] - u;
        if (local_e8.m_rows <= (long)uVar26) goto LAB_0068ebd5;
        auVar28 = ZEXT1664(ZEXT816(0));
        uVar11 = 0;
        pdVar20 = pdVar17;
        pdVar22 = pdVar23;
        do {
          if (local_e8.m_cols == uVar11) goto LAB_0068ebd5;
          dVar29 = *pdVar20;
          dVar2 = *(double *)((long)pvVar10 + uVar11 * 8 + 8);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = dVar2;
          dVar2 = dVar29 + dVar2;
          pdVar14[uVar11] = dVar2;
          if (local_e8.m_cols <= (long)uVar26) goto LAB_0068ebd5;
          uVar11 = uVar11 + 1;
          pdVar20 = pdVar20 + -1;
          auVar33._0_8_ = pdVar22[-1] / dVar2;
          auVar33._8_8_ = 0;
          auVar30 = vfmadd213sd_fma(auVar30,auVar33,auVar28._0_16_);
          dVar29 = auVar33._0_8_ * dVar29;
          auVar28 = ZEXT864((ulong)dVar29);
          *pdVar22 = auVar30._0_8_;
          pdVar22 = pdVar22 + local_e8.m_cols;
        } while (uVar26 != uVar11);
        if (uVar26 == uVar21) goto LAB_0068ebd5;
        local_e8.m_data[local_e8.m_cols * uVar26 + uVar26] = dVar29;
        uVar26 = uVar26 + 1;
      } while (uVar26 != p + 1);
    }
    if (-1 < p) {
      if (local_e8.m_cols <= (long)uVar19) goto LAB_0068ebd5;
      pdVar17 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                m_data;
      lVar25 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
               m_rows;
      uVar21 = 0;
      pdVar24 = local_e8.m_data + uVar19;
      do {
        if (((local_e8.m_rows == uVar21) || (lVar25 < 1)) ||
           ((DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols
            <= (long)uVar21)) goto LAB_0068ebd5;
        dVar29 = *pdVar24;
        pdVar24 = pdVar24 + local_e8.m_cols;
        pdVar17[uVar21] = dVar29;
        uVar21 = uVar21 + 1;
      } while (uVar12 != uVar21);
    }
    if (uVar5 != 1) {
      local_b8 = 1;
      if (1 < (int)uVar5) {
        local_b8 = (ulong)uVar5;
      }
      local_78 = (ulong)(p + 1U);
      if (p + 1U != 0) {
        local_58 = (long)p;
        uVar21 = 0;
        local_d0 = -1;
        local_60 = local_e8.m_cols * 8 ^ 0xfffffffffffffff8;
        local_80 = local_e8.m_data + local_58 + -1;
        local_c8 = local_e8.m_data + local_e8.m_cols * local_58;
        do {
          if (local_98.m_rows < 1 || local_98.m_cols < 1) goto LAB_0068ebd5;
          *local_98.m_data = 1.0;
          if (1 < (int)uVar5) {
            local_38 = uVar21 - 1;
            local_50 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                       m_storage.m_data + uVar21;
            local_70 = local_e8.m_data + local_e8.m_cols * uVar21;
            local_68 = local_e8.m_data + uVar21;
            local_c0 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                       m_storage.m_cols;
            local_48 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                       m_storage.m_rows;
            local_a8 = local_d0;
            uVar15 = uVar21;
            pdVar24 = local_c8;
            uVar26 = 1;
            uVar6 = 0;
            uVar8 = 1;
            local_b0 = local_80;
            do {
              uVar16 = uVar6;
              uVar27 = uVar26;
              auVar28 = ZEXT864(0) << 0x40;
              uVar11 = local_58 - uVar27;
              uVar26 = uVar21 - uVar27;
              local_40 = uVar21;
              if (uVar27 <= uVar21) {
                if (((local_98.m_rows <= (long)(ulong)uVar16) || ((long)uVar11 < -1)) ||
                   (((ulong)local_e8.m_cols <= uVar26 ||
                    ((local_e8.m_rows <= (long)(uVar11 + 1) ||
                     ((ulong)local_98.m_rows <= (ulong)uVar8)))))) goto LAB_0068ebd5;
                dVar29 = local_98.m_data[(ulong)uVar16 * local_98.m_cols];
                dVar2 = local_e8.m_data[(uVar11 + 1) * local_e8.m_cols + uVar26];
                local_98.m_data[(ulong)uVar8 * local_98.m_cols] = dVar29 / dVar2;
                if (((ulong)local_e8.m_cols <= uVar11) || ((ulong)local_e8.m_rows <= uVar26))
                goto LAB_0068ebd5;
                auVar28 = ZEXT864((ulong)((dVar29 / dVar2) *
                                         local_e8.m_data[local_e8.m_cols * uVar26 + uVar11]));
              }
              auVar30 = auVar28._0_16_;
              iVar7 = -(int)uVar26;
              if (-2 < (long)uVar26) {
                iVar7 = 1;
              }
              iVar13 = (int)uVar27 + -1;
              if ((long)uVar11 < local_38) {
                iVar13 = p - (int)uVar21;
              }
              local_a0 = uVar27;
              if (iVar7 <= iVar13) {
                if (local_98.m_rows <= (long)(ulong)uVar16) goto LAB_0068ebd5;
                lVar25 = (ulong)uVar16 * local_98.m_cols;
                pdVar17 = (double *)((local_a8 + iVar7) * local_e8.m_cols * 8 + (long)local_b0);
                uVar26 = (long)iVar7 - 1;
                do {
                  if (((((iVar7 < 0) || (uVar1 = uVar26 + 1, local_98.m_cols <= (long)uVar1)) ||
                       (iVar7 == 0)) || (((ulong)local_98.m_cols <= uVar26 || ((long)uVar11 < -1))))
                     || ((local_e8.m_rows <= (long)(uVar11 + 1) ||
                         (((ulong)local_e8.m_cols <= uVar15 + uVar26 ||
                          ((ulong)local_98.m_rows <= (ulong)uVar8)))))) goto LAB_0068ebd5;
                  auVar31._0_8_ =
                       (local_98.m_data[lVar25 + uVar26 + 1] - local_98.m_data[lVar25 + uVar26]) /
                       pdVar24[uVar26];
                  auVar31._8_8_ = 0;
                  local_98.m_data[local_98.m_cols * (ulong)uVar8 + uVar26 + 1] = auVar31._0_8_;
                  if (((ulong)local_e8.m_cols <= uVar11) ||
                     ((ulong)local_e8.m_rows <= uVar15 + uVar26)) goto LAB_0068ebd5;
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = *pdVar17;
                  auVar30 = vfmadd231sd_fma(auVar28._0_16_,auVar31,auVar3);
                  auVar28 = ZEXT1664(auVar30);
                  pdVar17 = pdVar17 + local_e8.m_cols;
                  uVar26 = uVar1;
                } while ((long)uVar1 < (long)iVar13);
              }
              dVar29 = auVar30._0_8_;
              if ((long)uVar21 <= (long)uVar11) {
                if (((((local_98.m_rows <= (long)(ulong)uVar16) || (local_98.m_cols < (long)uVar27))
                     || (local_e8.m_rows <= (long)(uVar11 + 1))) ||
                    ((local_e8.m_cols <= (long)uVar21 || ((ulong)local_98.m_rows <= (ulong)uVar8))))
                   || (local_98.m_cols <= (long)uVar27)) goto LAB_0068ebd5;
                auVar32._0_8_ =
                     -local_98.m_data[(ulong)uVar16 * local_98.m_cols + (uVar27 - 1)] /
                     local_68[(uVar11 + 1) * local_e8.m_cols];
                auVar32._8_8_ = 0x8000000000000000;
                local_98.m_data[(ulong)uVar8 * local_98.m_cols + uVar27] = auVar32._0_8_;
                if ((ulong)local_e8.m_cols <= uVar11) goto LAB_0068ebd5;
                auVar4._8_8_ = 0;
                auVar4._0_8_ = local_70[uVar11];
                auVar30 = vfmadd231sd_fma(auVar30,auVar32,auVar4);
                dVar29 = auVar30._0_8_;
              }
              if ((local_48 <= (long)uVar27) || (local_c0 <= (long)uVar21)) goto LAB_0068ebd5;
              pdVar24 = (double *)((long)pdVar24 + local_60);
              local_b0 = local_b0 + -1;
              local_a8 = local_a8 + -1;
              uVar15 = uVar15 - 1;
              local_50[local_c0 * uVar27] = dVar29;
              uVar26 = uVar27 + 1;
              uVar6 = uVar8;
              uVar8 = uVar16;
            } while (uVar27 + 1 != local_b8);
          }
          local_c8 = local_c8 + 1;
          local_d0 = local_d0 + 1;
          uVar21 = uVar21 + 1;
        } while (uVar21 != local_78);
      }
      if (1 < (int)uVar5) {
        lVar25 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                 m_rows;
        uVar21 = 1;
        lVar18 = 8;
        do {
          if (-1 < p) {
            if (lVar25 <= (long)uVar21) goto LAB_0068ebd5;
            uVar15 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                     m_storage.m_cols;
            uVar26 = 0;
            pdVar24 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                      m_storage.m_data;
            do {
              if ((~((long)uVar15 >> 0x3f) & uVar15) == uVar26) goto LAB_0068ebd5;
              *(double *)((long)pdVar24 + uVar26 * 8 + uVar15 * lVar18) =
                   (double)(int)uVar19 * *(double *)((long)pdVar24 + uVar26 * 8 + uVar15 * lVar18);
              uVar26 = uVar26 + 1;
            } while (uVar12 != uVar26);
          }
          iVar7 = (int)uVar21;
          uVar21 = uVar21 + 1;
          lVar18 = lVar18 + 8;
          uVar19 = (ulong)(uint)((int)uVar19 * (p - iVar7));
        } while (uVar21 != local_b8);
      }
      operator_delete__(pdVar9);
      operator_delete__(pvVar10);
    }
    if (local_98.m_data != (double *)0x0) {
      free((void *)local_98.m_data[-1]);
    }
    if (local_e8.m_data != (double *)0x0) {
      free((void *)local_e8.m_data[-1]);
    }
    return;
  }
LAB_0068ebd5:
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

static void BasisEvaluateDeriv(const int p,     ///< order of spline
                                   const int i,     ///< knot span, assume aready computed via FindSpan()
                                   const double u,  ///< parameter
                                   const ChVectorDynamic<>& knotU,  ///< knot vector
                                   ChMatrixDynamic<>& DN  ///< here return derivatives evaluated at u, that is: dN/du(u)
    ) {
        int order = (int)DN.rows() - 1;  // max order of derivatives (0th in row 0 of DN, 1st in row 1 of DN, etc.)
        double saved, temp;
        int j, k, j1, j2, r;

        double* left = new double[p + 1];
        double* right = new double[p + 1];

        ChMatrixDynamic<> ndu(p + 1, p + 1);
        ChMatrixDynamic<> a(p + 1, p + 1);

        ndu(0, 0) = 1.;
        for (j = 1; j <= p; j++) {
            left[j] = u - knotU(i + 1 - j);
            right[j] = knotU(i + j) - u;
            saved = 0.0;
            for (r = 0; r < j; r++) {
                ndu(j, r) = right[r + 1] + left[j - r];
                temp = ndu(r, j - 1) / ndu(j, r);

                ndu(r, j) = saved + right[r + 1] * temp;
                saved = left[j - r] * temp;
            }
            ndu(j, j) = saved;
        }
        for (j = 0; j <= p; j++)
            DN(0, j) = ndu(j, p);

        if (order == 0)
            return;

        for (r = 0; r <= p; r++) {
            int s1 = 0, s2 = 1;
            a(0, 0) = 1.0;

            for (k = 1; k <= order; k++) {
                double d = 0.;
                int rk = r - k, pk = p - k;
                if (r >= k) {
                    a(s2, 0) = a(s1, 0) / ndu(pk + 1, rk);
                    d = a(s2, 0) * ndu(rk, pk);
                }
                j1 = rk >= -1 ? 1 : -rk;
                j2 = (r - 1 <= pk) ? k - 1 : p - r;
                for (j = j1; j <= j2; j++) {
                    a(s2, j) = (a(s1, j) - a(s1, j - 1)) / ndu(pk + 1, rk + j);
                    d += a(s2, j) * ndu(rk + j, pk);
                }
                if (r <= pk) {
                    a(s2, k) = -a(s1, k - 1) / ndu(pk + 1, r);
                    d += a(s2, k) * ndu(r, pk);
                }
                DN(k, r) = d;
                j = s1;
                s1 = s2;
                s2 = j;
            }
        }
        r = p;
        for (k = 1; k <= order; k++) {
            for (j = 0; j <= p; j++)
                DN(k, j) *= r;
            r *= (p - k);
        }

        delete[] left;
        delete[] right;
    }